

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_address.c
# Opt level: O0

LY_ERR ipv4address_str2ip(char *value,size_t value_len,uint32_t options,ly_ctx *ctx,in_addr *addr,
                         char **zone,ly_err_item **err)

{
  int iVar1;
  char *pcVar2;
  size_t zone_len;
  char *addr_dyn;
  char *zone_ptr;
  char *addr_no_zone;
  LY_ERR ret;
  char **zone_local;
  in_addr *addr_local;
  ly_ctx *ctx_local;
  uint32_t options_local;
  size_t value_len_local;
  char *value_local;
  
  addr_no_zone._4_4_ = LY_SUCCESS;
  zone_len = 0;
  pcVar2 = ly_strnchr(value,0x25,value_len);
  zone_ptr = value;
  if (pcVar2 == (char *)0x0) {
    *zone = (char *)0x0;
    if ((options & 1) == 0) {
      zone_len = (size_t)strndup(value,value_len);
      zone_ptr = (char *)zone_len;
    }
  }
  else {
    addr_no_zone._4_4_ =
         lydict_insert(ctx,pcVar2 + 1,(value_len - ((long)pcVar2 - (long)value)) - 1,zone);
    if (addr_no_zone._4_4_ != LY_SUCCESS) goto LAB_00238ff3;
    if ((options & 1) == 0) {
      zone_len = (size_t)strndup(value,(long)pcVar2 - (long)value);
      zone_ptr = (char *)zone_len;
    }
    else {
      *pcVar2 = '\0';
    }
  }
  iVar1 = inet_pton(2,zone_ptr,addr);
  if (iVar1 == 0) {
    addr_no_zone._4_4_ =
         ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                    "Failed to convert IPv4 address \"%s\".",zone_ptr);
  }
  else if (((options & 1) != 0) && (pcVar2 != (char *)0x0)) {
    *pcVar2 = '%';
  }
LAB_00238ff3:
  free((void *)zone_len);
  return addr_no_zone._4_4_;
}

Assistant:

static LY_ERR
ipv4address_str2ip(const char *value, size_t value_len, uint32_t options, const struct ly_ctx *ctx,
        struct in_addr *addr, const char **zone, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *addr_no_zone;
    char *zone_ptr = NULL, *addr_dyn = NULL;
    size_t zone_len;

    /* store zone and get the string IPv4 address without it */
    if ((zone_ptr = ly_strnchr(value, '%', value_len))) {
        /* there is a zone index */
        zone_len = value_len - (zone_ptr - value) - 1;
        ret = lydict_insert(ctx, zone_ptr + 1, zone_len, zone);
        LY_CHECK_GOTO(ret, cleanup);

        /* get the IP without it */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            *zone_ptr = '\0';
            addr_no_zone = value;
        } else {
            addr_dyn = strndup(value, zone_ptr - value);
            addr_no_zone = addr_dyn;
        }
    } else {
        /* no zone */
        *zone = NULL;

        /* get the IP terminated with zero */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            /* we can use the value directly */
            addr_no_zone = value;
        } else {
            addr_dyn = strndup(value, value_len);
            addr_no_zone = addr_dyn;
        }
    }

    /* store the IPv4 address in network-byte order */
    if (!inet_pton(AF_INET, addr_no_zone, addr)) {
        ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Failed to convert IPv4 address \"%s\".", addr_no_zone);
        goto cleanup;
    }

    /* restore the value */
    if ((options & LYPLG_TYPE_STORE_DYNAMIC) && zone_ptr) {
        *zone_ptr = '%';
    }

cleanup:
    free(addr_dyn);
    return ret;
}